

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# textures.cpp
# Opt level: O1

string * __thiscall
pbrt::SpectrumScaledTexture::ToString_abi_cxx11_
          (string *__return_storage_ptr__,SpectrumScaledTexture *this)

{
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  detail::stringPrintfRecursive<pbrt::SpectrumTextureHandle_const&,pbrt::FloatTextureHandle_const&>
            (__return_storage_ptr__,"[ SpectrumScaledTexture tex: %s scale: %s ]",&this->tex,
             &this->scale);
  return __return_storage_ptr__;
}

Assistant:

std::string SpectrumScaledTexture::ToString() const {
    return StringPrintf("[ SpectrumScaledTexture tex: %s scale: %s ]", tex, scale);
}